

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screenshot.cpp
# Opt level: O2

void polyscope::screenshot(string *filename,bool transparentBG)

{
  uint w;
  uint h;
  bool bVar1;
  undefined7 in_register_00000031;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buff;
  string local_48;
  
  lVar6 = render::engine;
  *(undefined1 *)(render::engine + 0x221) = 1;
  if ((int)CONCAT71(in_register_00000031,transparentBG) != 0) {
    *(undefined1 *)(lVar6 + 0x220) = 1;
  }
  processLazyProperties();
  bVar1 = redrawRequested();
  requestRedraw();
  draw(false,false);
  if (bVar1) {
    requestRedraw();
  }
  h = view::bufferHeight;
  w = view::bufferWidth;
  lVar6 = (long)(int)view::bufferWidth;
  (**(code **)(**(long **)(render::engine + 0xc0) + 0x78))();
  if (!transparentBG) {
    lVar2 = 3;
    for (uVar3 = 0; lVar4 = lVar2, uVar5 = (ulong)(~((int)w >> 0x1f) & w),
        uVar3 != (~((int)h >> 0x1f) & h); uVar3 = uVar3 + 1) {
      while (uVar5 != 0) {
        buff.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[lVar4] = 0xff;
        lVar4 = lVar4 + 4;
        uVar5 = uVar5 - 1;
      }
      lVar2 = lVar2 + lVar6 * 4;
    }
  }
  std::__cxx11::string::string((string *)&local_48,(string *)filename);
  saveImage(&local_48,
            buff.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start,w,h,4);
  std::__cxx11::string::~string((string *)&local_48);
  lVar6 = render::engine;
  *(undefined1 *)(render::engine + 0x221) = 0;
  if (transparentBG) {
    *(undefined1 *)(lVar6 + 0x220) = 0;
  }
  geometrycentral::surface::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::
  ~_Vector_base((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&buff);
  return;
}

Assistant:

void screenshot(std::string filename, bool transparentBG) {

  render::engine->useAltDisplayBuffer = true;
  if (transparentBG) render::engine->lightCopy = true; // copy directly in to buffer without blending

  // == Make sure we render first
  processLazyProperties();

  // save the redraw requested bit and restore it below
  bool requestedAlready = redrawRequested();
  requestRedraw();

  draw(false, false);

  if (requestedAlready) {
    requestRedraw();
  }

  // these _should_ always be accurate
  int w = view::bufferWidth;
  int h = view::bufferHeight;
  std::vector<unsigned char> buff = render::engine->displayBufferAlt->readBuffer();

  // Set alpha to 1
  if (!transparentBG) {
    for (int j = 0; j < h; j++) {
      for (int i = 0; i < w; i++) {
        int ind = i + j * w;
        buff[4 * ind + 3] = std::numeric_limits<unsigned char>::max();
      }
    }
  }

  // Save to file
  saveImage(filename, &(buff.front()), w, h, 4);

  render::engine->useAltDisplayBuffer = false;
  if (transparentBG) render::engine->lightCopy = false;
}